

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *v)

{
  pointer pqVar1;
  long lVar2;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pqVar1 = (v->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      operator<<(os,(quath *)((long)&(pqVar1->imag)._M_elems[0].value + lVar2));
      if (uVar3 != ((long)(v->
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar3 = uVar3 + 1;
      pqVar1 = (v->
               super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 8;
    } while (uVar3 < (ulong)((long)(v->
                                   super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pqVar1 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}